

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsP2shScript(Script *this)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  ScriptOperator *pSVar5;
  bool local_11;
  Script *this_local;
  
  sVar2 = ByteData::GetDataSize(&this->script_data_);
  local_11 = false;
  if (sVar2 == 0x17) {
    sVar3 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                      (&this->script_stack_);
    local_11 = false;
    if (sVar3 == 3) {
      pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,0);
      pSVar5 = ScriptElement::GetOpCode(pvVar4);
      bVar1 = ScriptOperator::operator==(pSVar5,(ScriptOperator *)ScriptOperator::OP_HASH160);
      local_11 = false;
      if (bVar1) {
        pvVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        bVar1 = ScriptElement::IsBinary(pvVar4);
        local_11 = false;
        if (bVar1) {
          pvVar4 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,2);
          pSVar5 = ScriptElement::GetOpCode(pvVar4);
          local_11 = ScriptOperator::operator==(pSVar5,(ScriptOperator *)ScriptOperator::OP_EQUAL);
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool Script::IsP2shScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2shLength &&
      script_stack_.size() == 3 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_HASH160 &&
      script_stack_[1].IsBinary() &&
      script_stack_[2].GetOpCode() == ScriptOperator::OP_EQUAL);
}